

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Value::CZString::operator<(CZString *this,CZString *other)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  string local_38;
  
  if (this->cstr_ == (char *)0x0) {
    bVar2 = (this->field_1).index_ < (other->field_1).index_;
  }
  else {
    if (other->cstr_ == (char *)0x0) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"assert json failed","");
      throwLogicError(&local_38);
    }
    uVar4 = (this->field_1).index_ >> 2;
    uVar5 = (other->field_1).index_ >> 2;
    uVar1 = uVar4;
    if (uVar5 < uVar4) {
      uVar1 = uVar5;
    }
    iVar3 = memcmp(this->cstr_,other->cstr_,(ulong)uVar1);
    bVar2 = true;
    if (-1 < iVar3) {
      bVar2 = uVar4 < uVar5 && iVar3 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool Value::CZString::operator<(const CZString& other) const {
  if (!cstr_) return index_ < other.index_;
  //return strcmp(cstr_, other.cstr_) < 0;
  // Assume both are strings.
  unsigned this_len = this->storage_.length_;
  unsigned other_len = other.storage_.length_;
  unsigned min_len = std::min(this_len, other_len);
  JSON_ASSERT(this->cstr_ && other.cstr_);
  int comp = memcmp(this->cstr_, other.cstr_, min_len);
  if (comp < 0) return true;
  if (comp > 0) return false;
  return (this_len < other_len);
}